

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_prediction_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_5564d0::
DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
::RunTest(DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
          *this,bool speedtest,bool needsaturation,int p_angle)

{
  int *val;
  int *val_00;
  long *plVar1;
  ACMRandom *this_00;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  Message *pMVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  undefined7 in_register_00000011;
  ulong uVar10;
  int i_1;
  int iVar11;
  int iVar12;
  undefined7 in_register_00000031;
  ulong uVar13;
  ushort uVar14;
  SEARCH_METHODS *message;
  pointer puVar15;
  int iVar16;
  pointer puVar17;
  bool bVar18;
  uint16_t in_FPUControlWord;
  uint16_t in_FPUStatusWord;
  uint16_t in_FPULastInstructionOpcode;
  undefined8 in_FPUInstructionPointer;
  uint uVar19;
  uint uVar20;
  AssertHelper local_380;
  uint local_378;
  int local_374;
  int local_370;
  int local_36c;
  long local_368;
  int *local_360;
  int *local_358;
  ACMRandom *local_350;
  int *local_348;
  int *local_340;
  vector<unsigned_short,_std::allocator<unsigned_short>_> dst_tst;
  vector<unsigned_short,_std::allocator<unsigned_short>_> dst_ref;
  RegisterStateCheckMMX local_308;
  aom_usec_timer timer;
  unsigned_short above_data [160];
  unsigned_short left_data [160];
  int64_t iVar5;
  
  uVar4 = CONCAT71(in_register_00000011,needsaturation);
  this->bd_ = (this->params_).bit_depth;
  val = &this->bw_;
  val_00 = &this->bh_;
  uVar19 = p_angle - 0x5a;
  uVar20 = p_angle - 0xb4;
  local_358 = &this->upsample_above_;
  local_360 = &this->upsample_left_;
  local_350 = &this->rng_;
  local_374 = (int)CONCAT71(in_register_00000031,speedtest);
  iVar7 = 1;
  if (local_374 != 0) {
    iVar7 = 10000;
  }
  local_340 = &this->dx_;
  local_348 = &this->dy_;
  local_368 = 0;
  local_378 = (uint)uVar4;
  do {
    this_00 = local_350;
    if (local_368 == 0x13) {
      return;
    }
    bVar2 = (&(anonymous_namespace)::kTxSize)[local_368];
    iVar11 = ::tx_size_wide[bVar2];
    this->bw_ = iVar11;
    iVar16 = ::tx_size_high[bVar2];
    this->bh_ = iVar16;
    if (this->enable_upsample_ == 0) {
      *local_360 = 0;
      *local_358 = 0;
    }
    else {
      bVar18 = iVar11 + iVar16 < 0x11;
      *(ulong *)local_358 =
           (ulong)CONCAT14(bVar18,(uint)bVar18) &
           (CONCAT44(-(uint)(-0x7fffffd9 <
                             (int)((uVar20 ^ (int)uVar20 >> 0x1f) - ((int)uVar20 >> 0x1f) ^
                                  0x80000000) || uVar20 == 0),
                     -(uint)(-0x7fffffd9 <
                             (int)((uVar19 ^ (int)uVar19 >> 0x1f) - ((int)uVar19 >> 0x1f) ^
                                  0x80000000) || uVar19 == 0)) ^ 0xffffffffffffffff);
    }
    if ((char)uVar4 == '\0') {
      for (lVar8 = 0; lVar8 != 0xa0; lVar8 = lVar8 + 1) {
        bVar2 = libaom_test::ACMRandom::Rand8(this_00);
        left_data[lVar8] = (ushort)bVar2;
        bVar2 = libaom_test::ACMRandom::Rand8(this_00);
        above_data[lVar8] = (ushort)bVar2;
      }
      iVar16 = *val_00;
    }
    else {
      uVar14 = ~(ushort)(-1 << ((byte)this->bd_ & 0x1f));
      for (lVar8 = 0; lVar8 != 0xa0; lVar8 = lVar8 + 1) {
        left_data[lVar8] = uVar14;
        above_data[lVar8] = uVar14;
      }
    }
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              (&dst_ref,(long)(iVar16 * 0x50),(allocator_type *)&timer);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              (&dst_tst,(long)*val_00 * 0x50,(allocator_type *)&timer);
    puVar15 = dst_ref.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar17 = dst_tst.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start;
    this->bd_ = (this->params_).bit_depth;
    ::aom_usec_timer_start(&timer);
    iVar11 = iVar7;
    while (bVar18 = iVar11 != 0, iVar11 = iVar11 + -1, bVar18) {
      (*(this->params_).ref_fn)
                (puVar15,0x50,this->bw_,this->bh_,above_data + 0x10,left_data + 0x10,
                 this->upsample_above_,this->upsample_left_,this->dx_,this->dy_,this->bd_);
    }
    ::aom_usec_timer_mark(&timer);
    uVar4 = ::aom_usec_timer_elapsed(&timer);
    if ((this->params_).tst_fn ==
        (_func_void_unsigned_short_ptr_long_int_int_unsigned_short_ptr_unsigned_short_ptr_int_int_int_int_int
         *)0x0) {
      uVar9 = (ulong)(uint)*val;
      if (*val < 1) {
        uVar9 = 0;
      }
      uVar3 = *val_00;
      if (*val_00 < 1) {
        uVar3 = 0;
      }
      for (uVar10 = 0; uVar10 != uVar3; uVar10 = uVar10 + 1) {
        for (uVar13 = 0; uVar9 != uVar13; uVar13 = uVar13 + 1) {
          puVar17[uVar13] = puVar15[uVar13];
        }
        puVar17 = puVar17 + 0x50;
        puVar15 = puVar15 + 0x50;
      }
      uVar3 = 0;
    }
    else {
      ::aom_usec_timer_start(&timer);
      iVar11 = iVar7;
      while (bVar18 = iVar11 != 0, iVar11 = iVar11 + -1, bVar18) {
        local_308.pre_fpu_env_._12_6_ = SUB86(in_FPUInstructionPointer,0);
        local_308.pre_fpu_env_[9] = in_FPULastInstructionOpcode;
        local_308.pre_fpu_env_[0] = in_FPUControlWord;
        local_308.pre_fpu_env_[2] = in_FPUStatusWord;
        (*(this->params_).tst_fn)
                  (puVar17,0x50,this->bw_,this->bh_,above_data + 0x10,left_data + 0x10,
                   this->upsample_above_,this->upsample_left_,this->dx_,this->dy_,this->bd_);
        libaom_test::RegisterStateCheckMMX::~RegisterStateCheckMMX(&local_308);
      }
      ::aom_usec_timer_mark(&timer);
      iVar5 = ::aom_usec_timer_elapsed(&timer);
      uVar3 = (uint)iVar5;
    }
    if ((char)local_374 != '\0') {
      if ((this->params_).tst_fn ==
          (_func_void_unsigned_short_ptr_long_int_int_unsigned_short_ptr_unsigned_short_ptr_int_int_int_int_int
           *)0x0) {
        printf("\t[%8s] :: ref time %6d\n",
               *(undefined8 *)((anonymous_namespace)::kTxSizeStrings + local_368 * 8),
               uVar4 & 0xffffffff);
      }
      else {
        printf("\t[%8s] :: ref time %6d, tst time %6d     %3.2f\n",
               (double)((float)(int)uVar4 / (float)(int)uVar3),
               *(undefined8 *)((anonymous_namespace)::kTxSizeStrings + local_368 * 8),
               uVar4 & 0xffffffff,(ulong)uVar3);
      }
    }
    iVar11 = 0;
    for (iVar16 = 0; local_36c = iVar16, iVar16 < *val_00; iVar16 = iVar16 + 1) {
      for (iVar12 = 0; local_370 = iVar12, iVar12 < *val; iVar12 = iVar12 + 1) {
        testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
                  ((internal *)&timer,"dst_ref[r * dst_stride + c]","dst_tst[r * dst_stride + c]",
                   dst_ref.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_start + (uint)(iVar11 + iVar12),
                   dst_tst.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_start + (uint)(iVar11 + iVar12));
        if ((char)timer.begin.tv_sec == '\0') {
          testing::Message::Message((Message *)&local_308);
          pMVar6 = testing::Message::operator<<((Message *)&local_308,val);
          pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [2])0xaa8802);
          pMVar6 = testing::Message::operator<<(pMVar6,val_00);
          pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [5])" r: ");
          pMVar6 = testing::Message::operator<<(pMVar6,&local_36c);
          pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [5])" c: ");
          pMVar6 = testing::Message::operator<<(pMVar6,&local_370);
          pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [6])" dx: ");
          pMVar6 = testing::Message::operator<<(pMVar6,local_340);
          pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [6])" dy: ");
          pMVar6 = testing::Message::operator<<(pMVar6,local_348);
          pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [18])" upsample_above: ");
          pMVar6 = testing::Message::operator<<(pMVar6,local_358);
          pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [17])" upsample_left: ");
          pMVar6 = testing::Message::operator<<(pMVar6,local_360);
          if (timer.begin.tv_usec == 0) {
            message = "";
          }
          else {
            message = *(SEARCH_METHODS **)timer.begin.tv_usec;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_380,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/dr_prediction_test.cc"
                     ,0x10b,(char *)message);
          testing::internal::AssertHelper::operator=(&local_380,pMVar6);
          testing::internal::AssertHelper::~AssertHelper(&local_380);
          plVar1 = (long *)CONCAT26(local_308.pre_fpu_env_[3],
                                    CONCAT24(local_308.pre_fpu_env_[2],
                                             CONCAT22(local_308.pre_fpu_env_[1],
                                                      local_308.pre_fpu_env_[0])));
          if (plVar1 != (long *)0x0) {
            (**(code **)(*plVar1 + 8))();
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&timer.begin.tv_usec);
          std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                    (&dst_tst.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
          std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                    (&dst_ref.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
          return;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&timer.begin.tv_usec);
      }
      iVar11 = iVar11 + 0x50;
    }
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
              (&dst_tst.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
              (&dst_ref.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
    local_368 = local_368 + 1;
    uVar4 = (ulong)local_378;
  } while( true );
}

Assistant:

void RunTest(bool speedtest, bool needsaturation, int p_angle) {
    bd_ = params_.bit_depth;

    for (int tx = 0; tx < TX_SIZES_ALL; ++tx) {
      bw_ = tx_size_wide[kTxSize[tx]];
      bh_ = tx_size_high[kTxSize[tx]];

      if (enable_upsample_) {
        upsample_above_ =
            av1_use_intra_edge_upsample(bw_, bh_, p_angle - 90, 0);
        upsample_left_ =
            av1_use_intra_edge_upsample(bw_, bh_, p_angle - 180, 0);
      } else {
        upsample_above_ = upsample_left_ = 0;
      }

      // Declare input buffers as local arrays to allow checking for
      // over-reads.
      DECLARE_ALIGNED(16, Pixel, left_data[kNumIntraNeighbourPixels]);
      DECLARE_ALIGNED(16, Pixel, above_data[kNumIntraNeighbourPixels]);

      // We need to allow reading some previous bytes from the input pointers.
      const Pixel *above = &above_data[kIntraPredInputPadding];
      const Pixel *left = &left_data[kIntraPredInputPadding];

      if (needsaturation) {
        const Pixel sat = (1 << bd_) - 1;
        for (int i = 0; i < kNumIntraNeighbourPixels; ++i) {
          left_data[i] = sat;
          above_data[i] = sat;
        }
      } else {
        for (int i = 0; i < kNumIntraNeighbourPixels; ++i) {
          left_data[i] = rng_.Rand8();
          above_data[i] = rng_.Rand8();
        }
      }

      // Add additional padding to allow detection of over reads/writes when
      // the transform width is equal to MAX_TX_SIZE.
      const int dst_stride = MAX_TX_SIZE + 16;
      std::vector<Pixel> dst_ref(dst_stride * bh_);
      std::vector<Pixel> dst_tst(dst_stride * bh_);

      for (int r = 0; r < bh_; ++r) {
        ASAN_POISON_MEMORY_REGION(&dst_ref[r * dst_stride + bw_],
                                  (dst_stride - bw_) * sizeof(Pixel));
        ASAN_POISON_MEMORY_REGION(&dst_tst[r * dst_stride + bw_],
                                  (dst_stride - bw_) * sizeof(Pixel));
      }

      Predict(speedtest, tx, above, left, dst_ref.data(), dst_tst.data(),
              dst_stride);

      for (int r = 0; r < bh_; ++r) {
        ASAN_UNPOISON_MEMORY_REGION(&dst_ref[r * dst_stride + bw_],
                                    (dst_stride - bw_) * sizeof(Pixel));
        ASAN_UNPOISON_MEMORY_REGION(&dst_tst[r * dst_stride + bw_],
                                    (dst_stride - bw_) * sizeof(Pixel));
      }

      for (int r = 0; r < bh_; ++r) {
        for (int c = 0; c < bw_; ++c) {
          ASSERT_EQ(dst_ref[r * dst_stride + c], dst_tst[r * dst_stride + c])
              << bw_ << "x" << bh_ << " r: " << r << " c: " << c
              << " dx: " << dx_ << " dy: " << dy_
              << " upsample_above: " << upsample_above_
              << " upsample_left: " << upsample_left_;
        }
      }
    }
  }